

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  uint64 uVar4;
  int64 iVar5;
  FileDescriptor *this_00;
  DescriptorPool *pDVar6;
  DescriptorPool *pDVar7;
  string *psVar8;
  EnumDescriptor *pEVar9;
  UnknownFieldSet *in_RDX;
  FieldDescriptor *in_RSI;
  double dVar10;
  undefined1 auVar11 [16];
  Symbol SVar12;
  Symbol symbol;
  string fully_qualified_name;
  EnumValueDescriptor *enum_value;
  string *value_name;
  EnumDescriptor *enum_type;
  uint64 value;
  double value_2;
  float value_1;
  undefined4 in_stack_fffffffffffff888;
  int in_stack_fffffffffffff88c;
  OptionInterpreter *in_stack_fffffffffffff890;
  uint32 in_stack_fffffffffffff898;
  int in_stack_fffffffffffff89c;
  DescriptorBuilder *in_stack_fffffffffffff8a0;
  EnumDescriptor *in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b4;
  string *in_stack_fffffffffffff8d0;
  string *in_stack_fffffffffffff8d8;
  undefined7 in_stack_fffffffffffff8e8;
  undefined1 in_stack_fffffffffffff8ef;
  UnknownFieldSet *in_stack_fffffffffffff8f0;
  uint32 in_stack_fffffffffffff8f8;
  Type in_stack_fffffffffffff8fc;
  OptionInterpreter *in_stack_fffffffffffff900;
  Type TVar13;
  undefined8 in_stack_fffffffffffff908;
  int iVar14;
  OptionInterpreter *in_stack_fffffffffffff910;
  float local_670;
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [36];
  int local_494;
  string local_490 [32];
  string local_470 [8];
  UnknownFieldSet *in_stack_fffffffffffffb98;
  FieldDescriptor *in_stack_fffffffffffffba0;
  OptionInterpreter *in_stack_fffffffffffffba8;
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  Symbol local_3d0;
  string local_3c0 [32];
  anon_union_8_8_13f84498_for_Symbol_2 local_3a0;
  string *local_398;
  EnumDescriptor *local_390;
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  undefined8 local_2c8;
  string local_2c0 [32];
  string local_2a0 [32];
  double local_280;
  string local_278 [32];
  string local_258 [36];
  float local_234;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  undefined8 local_20;
  FieldDescriptor *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x6420cc);
  switch(CVar2) {
  case CPPTYPE_INT32:
    bVar1 = UninterpretedOption::has_positive_int_value((UninterpretedOption *)0x64210a);
    TVar13 = (Type)((ulong)in_stack_fffffffffffff900 >> 0x20);
    if (bVar1) {
      uVar4 = UninterpretedOption::positive_int_value((UninterpretedOption *)0x642124);
      if (0x7fffffff < uVar4) {
        FieldDescriptor::full_name_abi_cxx11_(local_18);
        std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       (char *)in_stack_fffffffffffff890);
        local_1 = AddValueError(in_stack_fffffffffffff890,
                                (string *)
                                CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        std::__cxx11::string::~string(local_40);
        std::__cxx11::string::~string(local_60);
        goto LAB_00643b5e;
      }
      FieldDescriptor::number(local_18);
      UninterpretedOption::positive_int_value((UninterpretedOption *)0x642237);
      FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffff8a0);
      SetInt32(in_stack_fffffffffffff910,(int)((ulong)in_stack_fffffffffffff908 >> 0x20),
               (int32)in_stack_fffffffffffff908,TVar13,
               (UnknownFieldSet *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    }
    else {
      bVar1 = UninterpretedOption::has_negative_int_value((UninterpretedOption *)0x642286);
      if (!bVar1) {
        FieldDescriptor::full_name_abi_cxx11_(local_18);
        std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       (char *)in_stack_fffffffffffff890);
        local_1 = AddValueError(in_stack_fffffffffffff890,
                                (string *)
                                CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        std::__cxx11::string::~string(local_d0);
        std::__cxx11::string::~string(local_f0);
        goto LAB_00643b5e;
      }
      iVar5 = UninterpretedOption::negative_int_value((UninterpretedOption *)0x6422a0);
      if (iVar5 < -0x80000000) {
        FieldDescriptor::full_name_abi_cxx11_(local_18);
        std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       (char *)in_stack_fffffffffffff890);
        local_1 = AddValueError(in_stack_fffffffffffff890,
                                (string *)
                                CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        std::__cxx11::string::~string(local_90);
        std::__cxx11::string::~string(local_b0);
        goto LAB_00643b5e;
      }
      FieldDescriptor::number(local_18);
      UninterpretedOption::negative_int_value((UninterpretedOption *)0x6423b3);
      FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffff8a0);
      SetInt32(in_stack_fffffffffffff910,(int)((ulong)in_stack_fffffffffffff908 >> 0x20),
               (int32)in_stack_fffffffffffff908,TVar13,
               (UnknownFieldSet *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    }
    break;
  case CPPTYPE_INT64:
    bVar1 = UninterpretedOption::has_positive_int_value((UninterpretedOption *)0x6424e9);
    iVar14 = (int)((ulong)in_stack_fffffffffffff908 >> 0x20);
    if (bVar1) {
      uVar4 = UninterpretedOption::positive_int_value((UninterpretedOption *)0x642503);
      if (0x7fffffffffffffff < uVar4) {
        FieldDescriptor::full_name_abi_cxx11_(local_18);
        std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       (char *)in_stack_fffffffffffff890);
        local_1 = AddValueError(in_stack_fffffffffffff890,
                                (string *)
                                CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string(local_130);
        goto LAB_00643b5e;
      }
      FieldDescriptor::number(local_18);
      UninterpretedOption::positive_int_value((UninterpretedOption *)0x64261d);
      FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffff8a0);
      SetInt64(in_stack_fffffffffffff910,iVar14,(int64)in_stack_fffffffffffff900,
               in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    }
    else {
      bVar1 = UninterpretedOption::has_negative_int_value((UninterpretedOption *)0x64266e);
      if (!bVar1) {
        FieldDescriptor::full_name_abi_cxx11_(local_18);
        std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       (char *)in_stack_fffffffffffff890);
        local_1 = AddValueError(in_stack_fffffffffffff890,
                                (string *)
                                CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        std::__cxx11::string::~string(local_150);
        std::__cxx11::string::~string(local_170);
        goto LAB_00643b5e;
      }
      FieldDescriptor::number(local_18);
      UninterpretedOption::negative_int_value((UninterpretedOption *)0x64269b);
      FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffff8a0);
      SetInt64(in_stack_fffffffffffff910,iVar14,(int64)in_stack_fffffffffffff900,
               in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    }
    break;
  case CPPTYPE_UINT32:
    bVar1 = UninterpretedOption::has_positive_int_value((UninterpretedOption *)0x6427d3);
    TVar13 = (Type)((ulong)in_stack_fffffffffffff8f0 >> 0x20);
    if (!bVar1) {
      FieldDescriptor::full_name_abi_cxx11_(local_18);
      std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (char *)in_stack_fffffffffffff890);
      local_1 = AddValueError(in_stack_fffffffffffff890,
                              (string *)
                              CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string(local_1f0);
      goto LAB_00643b5e;
    }
    uVar4 = UninterpretedOption::positive_int_value((UninterpretedOption *)0x6427ed);
    if (0xffffffff < uVar4) {
      FieldDescriptor::name_abi_cxx11_(local_18);
      std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (char *)in_stack_fffffffffffff890);
      local_1 = AddValueError(in_stack_fffffffffffff890,
                              (string *)
                              CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_1b0);
      goto LAB_00643b5e;
    }
    FieldDescriptor::number(local_18);
    UninterpretedOption::positive_int_value((UninterpretedOption *)0x642902);
    FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffff8a0);
    SetUInt32(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8,TVar13,
              (UnknownFieldSet *)CONCAT17(in_stack_fffffffffffff8ef,in_stack_fffffffffffff8e8));
    break;
  case CPPTYPE_UINT64:
    bVar1 = UninterpretedOption::has_positive_int_value((UninterpretedOption *)0x642a36);
    iVar14 = (int)((ulong)in_stack_fffffffffffff908 >> 0x20);
    if (!bVar1) {
      FieldDescriptor::full_name_abi_cxx11_(local_18);
      std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (char *)in_stack_fffffffffffff890);
      local_1 = AddValueError(in_stack_fffffffffffff890,
                              (string *)
                              CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
      std::__cxx11::string::~string(local_210);
      std::__cxx11::string::~string(local_230);
      goto LAB_00643b5e;
    }
    FieldDescriptor::number(local_18);
    UninterpretedOption::positive_int_value((UninterpretedOption *)0x642a63);
    FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffff8a0);
    SetUInt64(in_stack_fffffffffffff910,iVar14,(uint64)in_stack_fffffffffffff900,
              in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f0);
    break;
  case CPPTYPE_DOUBLE:
    bVar1 = UninterpretedOption::has_double_value((UninterpretedOption *)0x642dc3);
    iVar14 = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
    if (bVar1) {
      local_280 = UninterpretedOption::double_value((UninterpretedOption *)0x642dda);
    }
    else {
      bVar1 = UninterpretedOption::has_positive_int_value((UninterpretedOption *)0x642df9);
      if (bVar1) {
        uVar4 = UninterpretedOption::positive_int_value((UninterpretedOption *)0x642e10);
        auVar11._8_4_ = (int)(uVar4 >> 0x20);
        auVar11._0_8_ = uVar4;
        auVar11._12_4_ = 0x45300000;
        local_280 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
      }
      else {
        bVar1 = UninterpretedOption::has_negative_int_value((UninterpretedOption *)0x642e56);
        if (!bVar1) {
          FieldDescriptor::full_name_abi_cxx11_(local_18);
          std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                         (char *)in_stack_fffffffffffff890);
          local_1 = AddValueError(in_stack_fffffffffffff890,
                                  (string *)
                                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          std::__cxx11::string::~string(local_2a0);
          std::__cxx11::string::~string(local_2c0);
          goto LAB_00643b5e;
        }
        iVar5 = UninterpretedOption::negative_int_value((UninterpretedOption *)0x642e6d);
        local_280 = (double)iVar5;
      }
    }
    FieldDescriptor::number(local_18);
    internal::WireFormatLite::EncodeDouble(local_280);
    UnknownFieldSet::AddFixed64
              ((UnknownFieldSet *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               iVar14,(uint64)in_stack_fffffffffffff8a0);
    break;
  case CPPTYPE_FLOAT:
    bVar1 = UninterpretedOption::has_double_value((UninterpretedOption *)0x642b99);
    if (bVar1) {
      dVar10 = UninterpretedOption::double_value((UninterpretedOption *)0x642bb0);
      local_234 = (float)dVar10;
    }
    else {
      bVar1 = UninterpretedOption::has_positive_int_value((UninterpretedOption *)0x642bd3);
      if (bVar1) {
        uVar4 = UninterpretedOption::positive_int_value((UninterpretedOption *)0x642bea);
        local_670 = (float)uVar4;
        local_234 = local_670;
      }
      else {
        bVar1 = UninterpretedOption::has_negative_int_value((UninterpretedOption *)0x642c57);
        if (!bVar1) {
          FieldDescriptor::full_name_abi_cxx11_(local_18);
          std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                         (char *)in_stack_fffffffffffff890);
          local_1 = AddValueError(in_stack_fffffffffffff890,
                                  (string *)
                                  CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          std::__cxx11::string::~string(local_258);
          std::__cxx11::string::~string(local_278);
          goto LAB_00643b5e;
        }
        iVar5 = UninterpretedOption::negative_int_value((UninterpretedOption *)0x642c6e);
        local_234 = (float)iVar5;
      }
    }
    FieldDescriptor::number(local_18);
    internal::WireFormatLite::EncodeFloat(local_234);
    UnknownFieldSet::AddFixed32
              ((UnknownFieldSet *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,
               in_stack_fffffffffffff898);
    break;
  case CPPTYPE_BOOL:
    bVar1 = UninterpretedOption::has_identifier_value((UninterpretedOption *)0x642fc3);
    iVar14 = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
    if (!bVar1) {
      FieldDescriptor::full_name_abi_cxx11_(local_18);
      std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (char *)in_stack_fffffffffffff890);
      local_1 = AddValueError(in_stack_fffffffffffff890,
                              (string *)
                              CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
      std::__cxx11::string::~string(local_2e8);
      std::__cxx11::string::~string(local_308);
      goto LAB_00643b5e;
    }
    UninterpretedOption::identifier_value_abi_cxx11_((UninterpretedOption *)0x6430bc);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff890,
                            (char *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    if (bVar1) {
      local_2c8 = 1;
    }
    else {
      UninterpretedOption::identifier_value_abi_cxx11_((UninterpretedOption *)0x6430f3);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff890,
                              (char *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888))
      ;
      if (!bVar1) {
        FieldDescriptor::full_name_abi_cxx11_(local_18);
        std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       (char *)in_stack_fffffffffffff890);
        local_1 = AddValueError(in_stack_fffffffffffff890,
                                (string *)
                                CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        std::__cxx11::string::~string(local_328);
        std::__cxx11::string::~string(local_348);
        goto LAB_00643b5e;
      }
      local_2c8 = 0;
    }
    FieldDescriptor::number(local_18);
    UnknownFieldSet::AddVarint
              ((UnknownFieldSet *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
               iVar14,(uint64)in_stack_fffffffffffff8a0);
    break;
  case CPPTYPE_ENUM:
    bVar1 = UninterpretedOption::has_identifier_value((UninterpretedOption *)0x643245);
    if (!bVar1) {
      FieldDescriptor::full_name_abi_cxx11_(local_18);
      std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (char *)in_stack_fffffffffffff890);
      local_1 = AddValueError(in_stack_fffffffffffff890,
                              (string *)
                              CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
      std::__cxx11::string::~string(local_368);
      std::__cxx11::string::~string(local_388);
      goto LAB_00643b5e;
    }
    local_390 = FieldDescriptor::enum_type((FieldDescriptor *)in_stack_fffffffffffff890);
    local_398 = UninterpretedOption::identifier_value_abi_cxx11_((UninterpretedOption *)0x643356);
    local_3a0.descriptor = (Descriptor *)0x0;
    this_00 = EnumDescriptor::file(local_390);
    pDVar6 = FileDescriptor::pool(this_00);
    pDVar7 = DescriptorPool::generated_pool();
    if (pDVar6 == pDVar7) {
      local_3a0.enum_value_descriptor =
           EnumDescriptor::FindValueByName
                     (in_stack_fffffffffffff8a8,(string *)in_stack_fffffffffffff8a0);
    }
    else {
      psVar8 = EnumDescriptor::full_name_abi_cxx11_(local_390);
      std::__cxx11::string::string(local_3c0,(string *)psVar8);
      std::__cxx11::string::size();
      EnumDescriptor::name_abi_cxx11_(local_390);
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)local_3c0);
      std::__cxx11::string::operator+=(local_3c0,(string *)local_398);
      SVar12 = FindSymbolNotEnforcingDeps
                         (in_stack_fffffffffffff8a0,
                          (string *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                          SUB81((ulong)in_stack_fffffffffffff890 >> 0x38,0));
      local_3d0.field_1 = SVar12.field_1;
      local_3d0.type = SVar12.type;
      bVar1 = Symbol::IsNull(&local_3d0);
      if ((bVar1) || (local_3d0.type != ENUM_VALUE)) {
LAB_00643720:
        local_494 = 0;
      }
      else {
        pEVar9 = EnumValueDescriptor::type(local_3d0.field_1.enum_value_descriptor);
        if (pEVar9 == local_390) {
          local_3a0.descriptor = local_3d0.field_1.descriptor;
          goto LAB_00643720;
        }
        in_stack_fffffffffffff8d8 = EnumDescriptor::full_name_abi_cxx11_(local_390);
        std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       (char *)in_stack_fffffffffffff890);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff890);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       (char *)in_stack_fffffffffffff890);
        in_stack_fffffffffffff8d0 = FieldDescriptor::full_name_abi_cxx11_(local_18);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff890);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       (char *)in_stack_fffffffffffff890);
        local_1 = AddValueError(in_stack_fffffffffffff890,
                                (string *)
                                CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
        std::__cxx11::string::~string(local_3f0);
        std::__cxx11::string::~string(local_410);
        std::__cxx11::string::~string(local_430);
        std::__cxx11::string::~string(local_450);
        std::__cxx11::string::~string(local_470);
        std::__cxx11::string::~string(local_490);
        local_494 = 1;
      }
      std::__cxx11::string::~string(local_3c0);
      if (local_494 != 0) goto LAB_00643b5e;
    }
    if (local_3a0.descriptor == (Descriptor *)0x0) {
      pEVar9 = FieldDescriptor::enum_type((FieldDescriptor *)in_stack_fffffffffffff890);
      EnumDescriptor::full_name_abi_cxx11_(pEVar9);
      std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (char *)in_stack_fffffffffffff890);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff890);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (char *)in_stack_fffffffffffff890);
      FieldDescriptor::full_name_abi_cxx11_(local_18);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff890);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (char *)in_stack_fffffffffffff890);
      local_1 = AddValueError(in_stack_fffffffffffff890,
                              (string *)
                              CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
      std::__cxx11::string::~string(local_4b8);
      std::__cxx11::string::~string(local_4d8);
      std::__cxx11::string::~string(local_4f8);
      std::__cxx11::string::~string(local_518);
      std::__cxx11::string::~string(local_538);
      std::__cxx11::string::~string(local_558);
      goto LAB_00643b5e;
    }
    iVar14 = local_20._4_4_;
    iVar3 = FieldDescriptor::number(local_18);
    EnumValueDescriptor::number(local_3a0.enum_value_descriptor);
    UnknownFieldSet::AddVarint
              ((UnknownFieldSet *)CONCAT44(in_stack_fffffffffffff8b4,iVar3),iVar14,
               (uint64)in_stack_fffffffffffff8a0);
    break;
  case CPPTYPE_STRING:
    bVar1 = UninterpretedOption::has_string_value((UninterpretedOption *)0x643a09);
    if (!bVar1) {
      FieldDescriptor::full_name_abi_cxx11_(local_18);
      std::operator+((char *)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (char *)in_stack_fffffffffffff890);
      local_1 = AddValueError(in_stack_fffffffffffff890,
                              (string *)
                              CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
      std::__cxx11::string::~string(local_578);
      std::__cxx11::string::~string(local_598);
      goto LAB_00643b5e;
    }
    FieldDescriptor::number(local_18);
    UninterpretedOption::string_value_abi_cxx11_((UninterpretedOption *)0x643b16);
    UnknownFieldSet::AddLengthDelimited(local_20,in_stack_fffffffffffff88c,(string *)0x643b27);
    break;
  case CPPTYPE_MESSAGE:
    bVar1 = SetAggregateOption(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                               in_stack_fffffffffffffb98);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00643b5e;
    }
  }
  local_1 = 1;
LAB_00643b5e:
  return (bool)(local_1 & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetOptionValue(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  // We switch on the CppType to validate.
  switch (option_field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64>(kint32max)) {
          return AddValueError("Value out of range for int32 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        if (uninterpreted_option_->negative_int_value() <
            static_cast<int64>(kint32min)) {
          return AddValueError("Value out of range for int32 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->negative_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError("Value must be integer for int32 option \"" +
                             option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_INT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64>(kint64max)) {
          return AddValueError("Value out of range for int64 option \"" +
                               option_field->full_name() + "\".");
        } else {
          SetInt64(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        SetInt64(option_field->number(),
                 uninterpreted_option_->negative_int_value(),
                 option_field->type(), unknown_fields);
      } else {
        return AddValueError("Value must be integer for int64 option \"" +
                             option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() > kuint32max) {
          return AddValueError("Value out of range for uint32 option \"" +
                               option_field->name() + "\".");
        } else {
          SetUInt32(option_field->number(),
                    uninterpreted_option_->positive_int_value(),
                    option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError(
            "Value must be non-negative integer for uint32 "
            "option \"" +
            option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        SetUInt64(option_field->number(),
                  uninterpreted_option_->positive_int_value(),
                  option_field->type(), unknown_fields);
      } else {
        return AddValueError(
            "Value must be non-negative integer for uint64 "
            "option \"" +
            option_field->full_name() + "\".");
      }
      break;

    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else {
        return AddValueError("Value must be number for float option \"" +
                             option_field->full_name() + "\".");
      }
      unknown_fields->AddFixed32(option_field->number(),
                                 internal::WireFormatLite::EncodeFloat(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else {
        return AddValueError("Value must be number for double option \"" +
                             option_field->full_name() + "\".");
      }
      unknown_fields->AddFixed64(option_field->number(),
                                 internal::WireFormatLite::EncodeDouble(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_BOOL:
      uint64 value;
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError(
            "Value must be identifier for boolean option "
            "\"" +
            option_field->full_name() + "\".");
      }
      if (uninterpreted_option_->identifier_value() == "true") {
        value = 1;
      } else if (uninterpreted_option_->identifier_value() == "false") {
        value = 0;
      } else {
        return AddValueError(
            "Value must be \"true\" or \"false\" for boolean "
            "option \"" +
            option_field->full_name() + "\".");
      }
      unknown_fields->AddVarint(option_field->number(), value);
      break;

    case FieldDescriptor::CPPTYPE_ENUM: {
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError(
            "Value must be identifier for enum-valued option "
            "\"" +
            option_field->full_name() + "\".");
      }
      const EnumDescriptor* enum_type = option_field->enum_type();
      const std::string& value_name = uninterpreted_option_->identifier_value();
      const EnumValueDescriptor* enum_value = nullptr;

      if (enum_type->file()->pool() != DescriptorPool::generated_pool()) {
        // Note that the enum value's fully-qualified name is a sibling of the
        // enum's name, not a child of it.
        std::string fully_qualified_name = enum_type->full_name();
        fully_qualified_name.resize(fully_qualified_name.size() -
                                    enum_type->name().size());
        fully_qualified_name += value_name;

        // Search for the enum value's descriptor in the builder's pool. Note
        // that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
        // DescriptorPool::FindEnumValueByName() because we're already holding
        // the pool's mutex, and the latter method locks it again.
        Symbol symbol =
            builder_->FindSymbolNotEnforcingDeps(fully_qualified_name);
        if (!symbol.IsNull() && symbol.type == Symbol::ENUM_VALUE) {
          if (symbol.enum_value_descriptor->type() != enum_type) {
            return AddValueError(
                "Enum type \"" + enum_type->full_name() +
                "\" has no value named \"" + value_name + "\" for option \"" +
                option_field->full_name() +
                "\". This appears to be a value from a sibling type.");
          } else {
            enum_value = symbol.enum_value_descriptor;
          }
        }
      } else {
        // The enum type is in the generated pool, so we can search for the
        // value there.
        enum_value = enum_type->FindValueByName(value_name);
      }

      if (enum_value == nullptr) {
        return AddValueError("Enum type \"" +
                             option_field->enum_type()->full_name() +
                             "\" has no value named \"" + value_name +
                             "\" for "
                             "option \"" +
                             option_field->full_name() + "\".");
      } else {
        // Sign-extension is not a problem, since we cast directly from int32 to
        // uint64, without first going through uint32.
        unknown_fields->AddVarint(
            option_field->number(),
            static_cast<uint64>(static_cast<int64>(enum_value->number())));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_STRING:
      if (!uninterpreted_option_->has_string_value()) {
        return AddValueError(
            "Value must be quoted string for string option "
            "\"" +
            option_field->full_name() + "\".");
      }
      // The string has already been unquoted and unescaped by the parser.
      unknown_fields->AddLengthDelimited(option_field->number(),
                                         uninterpreted_option_->string_value());
      break;

    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (!SetAggregateOption(option_field, unknown_fields)) {
        return false;
      }
      break;
  }

  return true;
}